

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

Cylinder *
pbrt::Cylinder::Create
          (Transform *renderFromObject,Transform *objectFromRender,bool reverseOrientation,
          ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined1 auVar10 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar11 [16];
  string local_90;
  Float local_6c;
  Float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  Float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  Float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  Cylinder *pCVar9;
  
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"radius","");
  local_6c = ParameterDictionary::GetOneFloat(parameters,&local_90,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"zmin","");
  local_48 = ParameterDictionary::GetOneFloat(parameters,&local_90,-1.0);
  uStack_44 = extraout_XMM0_Db;
  uStack_40 = extraout_XMM0_Dc;
  uStack_3c = extraout_XMM0_Dd;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"zmax","");
  local_58 = ParameterDictionary::GetOneFloat(parameters,&local_90,1.0);
  uStack_54 = extraout_XMM0_Db_00;
  uStack_50 = extraout_XMM0_Dc_00;
  uStack_4c = extraout_XMM0_Dd_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"phimax","");
  local_68 = ParameterDictionary::GetOneFloat(parameters,&local_90,360.0);
  uStack_64 = extraout_XMM0_Db_01;
  uStack_60 = extraout_XMM0_Dc_01;
  uStack_5c = extraout_XMM0_Dd_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  iVar8 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x28,8);
  pCVar9 = (Cylinder *)CONCAT44(extraout_var,iVar8);
  pCVar9->renderFromObject = renderFromObject;
  pCVar9->objectFromRender = objectFromRender;
  pCVar9->reverseOrientation = reverseOrientation;
  bVar7 = Transform::SwapsHandedness(renderFromObject);
  pCVar9->transformSwapsHandedness = bVar7;
  pCVar9->radius = local_6c;
  auVar6._4_4_ = uStack_44;
  auVar6._0_4_ = local_48;
  auVar6._8_4_ = uStack_40;
  auVar6._12_4_ = uStack_3c;
  auVar3._4_4_ = uStack_54;
  auVar3._0_4_ = local_58;
  auVar3._8_4_ = uStack_50;
  auVar3._12_4_ = uStack_4c;
  auVar3 = vminss_avx(auVar3,auVar6);
  pCVar9->zMin = auVar3._0_4_;
  auVar5._4_4_ = uStack_64;
  auVar5._0_4_ = local_68;
  auVar5._8_4_ = uStack_60;
  auVar5._12_4_ = uStack_5c;
  auVar3 = vinsertps_avx(auVar6,auVar5,0x10);
  auVar11._4_8_ = SUB128(ZEXT812(0),4);
  auVar11._0_4_ = local_58;
  auVar11._12_4_ = 0;
  uVar4 = vcmpps_avx512vl(auVar3,auVar11,1);
  auVar3 = vminss_avx(SUB6416(ZEXT464(0x43b40000),0),auVar5);
  auVar3 = vinsertps_avx(auVar6,ZEXT416((uint)(auVar3._0_4_ * 0.017453292)),0x10);
  bVar7 = (bool)((byte)uVar4 & 1);
  auVar10._0_4_ = (uint)bVar7 * (int)local_58 | (uint)!bVar7 * auVar3._0_4_;
  auVar10._4_4_ = (uint)!(bool)((byte)(uVar4 >> 1) & 1) * auVar3._4_4_;
  auVar10._8_4_ = (uint)!(bool)((byte)(uVar4 >> 2) & 1) * auVar3._8_4_;
  auVar10._12_4_ = (uint)!(bool)((byte)(uVar4 >> 3) & 1) * auVar3._12_4_;
  uVar2 = vmovlps_avx(auVar10);
  pCVar9->zMax = (Float)(int)uVar2;
  pCVar9->phiMax = (Float)(int)((ulong)uVar2 >> 0x20);
  return pCVar9;
}

Assistant:

Cylinder *Cylinder::Create(const Transform *renderFromObject,
                           const Transform *objectFromRender, bool reverseOrientation,
                           const ParameterDictionary &parameters, const FileLoc *loc,
                           Allocator alloc) {
    Float radius = parameters.GetOneFloat("radius", 1);
    Float zmin = parameters.GetOneFloat("zmin", -1);
    Float zmax = parameters.GetOneFloat("zmax", 1);
    Float phimax = parameters.GetOneFloat("phimax", 360);
    return alloc.new_object<Cylinder>(renderFromObject, objectFromRender,
                                      reverseOrientation, radius, zmin, zmax, phimax);
}